

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

ptr<Expression> __thiscall Parser::postfix(Parser *this,ptr<Expression> *callee)

{
  bool bVar1;
  shared_ptr<Expression> *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  ptr<Expression> pVar3;
  shared_ptr<Expression> local_60;
  shared_ptr<Expression> local_50 [2];
  shared_ptr<Expression> local_30;
  ptr<Expression> *callee_local;
  Parser *this_local;
  
  callee_local = callee;
  this_local = this;
  bVar1 = match((Parser *)callee,LeftParen);
  if (bVar1) {
    std::shared_ptr<Expression>::shared_ptr(&local_30,in_RDX);
    call(this,callee);
    std::shared_ptr<Expression>::~shared_ptr(&local_30);
    _Var2._M_pi = extraout_RDX;
  }
  else {
    bVar1 = match((Parser *)callee,LeftBrack);
    if (bVar1) {
      std::shared_ptr<Expression>::shared_ptr(local_50,in_RDX);
      access(this,(char *)callee,(int)local_50);
      std::shared_ptr<Expression>::~shared_ptr(local_50);
      _Var2._M_pi = extraout_RDX_00;
    }
    else {
      bVar1 = match((Parser *)callee,Dot);
      if (bVar1) {
        std::shared_ptr<Expression>::shared_ptr(&local_60,in_RDX);
        memberAccess(this,callee);
        std::shared_ptr<Expression>::~shared_ptr(&local_60);
        _Var2._M_pi = extraout_RDX_01;
      }
      else {
        std::shared_ptr<Expression>::shared_ptr((shared_ptr<Expression> *)this,in_RDX);
        _Var2._M_pi = extraout_RDX_02;
      }
    }
  }
  pVar3.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var2._M_pi;
  pVar3.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (ptr<Expression>)pVar3.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<Expression> Parser::postfix(ptr<Expression> callee) {
    if(match(TokenType::LeftParen)) {
        return call(callee);
    } else if(match(TokenType::LeftBrack)) {
        return access(callee);
    } else if(match(TokenType::Dot)) {
        return memberAccess(callee);
    }
    return callee;
}